

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# physical_table_scan.cpp
# Opt level: O1

ProgressData * __thiscall
duckdb::PhysicalTableScan::GetProgress
          (ProgressData *__return_storage_ptr__,PhysicalTableScan *this,ClientContext *context,
          GlobalSourceState *gstate_p)

{
  table_function_progress_t p_Var1;
  double dVar2;
  
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 0.0;
  __return_storage_ptr__->invalid = false;
  p_Var1 = (this->function).table_scan_progress;
  if (p_Var1 == (table_function_progress_t)0x0) {
    __return_storage_ptr__->invalid = true;
  }
  else {
    dVar2 = (*p_Var1)(context,(this->bind_data).
                              super_unique_ptr<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                              ._M_t.
                              super___uniq_ptr_impl<duckdb::FunctionData,_std::default_delete<duckdb::FunctionData>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_duckdb::FunctionData_*,_std::default_delete<duckdb::FunctionData>_>
                              .super__Head_base<0UL,_duckdb::FunctionData_*,_false>._M_head_impl,
                      *(GlobalTableFunctionState **)&gstate_p[1].super_StateWithBlockableTasks);
    if (0.0 <= dVar2) {
      __return_storage_ptr__->done = dVar2;
      __return_storage_ptr__->total = 100.0;
      ProgressData::Normalize(__return_storage_ptr__,1000.0);
      return __return_storage_ptr__;
    }
    __return_storage_ptr__->invalid = true;
  }
  __return_storage_ptr__->done = 0.0;
  __return_storage_ptr__->total = 1.0;
  return __return_storage_ptr__;
}

Assistant:

ProgressData PhysicalTableScan::GetProgress(ClientContext &context, GlobalSourceState &gstate_p) const {
	auto &gstate = gstate_p.Cast<TableScanGlobalSourceState>();
	ProgressData res;
	if (function.table_scan_progress) {
		double table_progress = function.table_scan_progress(context, bind_data.get(), gstate.global_state.get());
		if (table_progress < 0.0) {
			res.SetInvalid();
		} else {
			res.done = table_progress;
			res.total = 100.0;
			// Assume cardinality is always 1e3
			res.Normalize(1e3);
		}
	} else {
		// if table_scan_progress is not implemented we don't support this function yet in the progress bar
		res.SetInvalid();
	}
	return res;
}